

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpSolver.cc
# Opt level: O0

void __thiscall Glucose::SimpSolver::gatherTouchedClauses(SimpSolver *this)

{
  int iVar1;
  uint32_t uVar2;
  int iVar3;
  Clause *pCVar4;
  char *pcVar5;
  vec<unsigned_int> *this_00;
  long in_RDI;
  vec<unsigned_int> *cs;
  int j;
  int i;
  Ref in_stack_ffffffffffffff8c;
  Queue<unsigned_int> *in_stack_ffffffffffffff90;
  int *in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa4;
  long in_stack_ffffffffffffffc8;
  Queue<unsigned_int> *in_stack_ffffffffffffffd0;
  int local_10;
  int local_c;
  
  if (*(int *)(in_RDI + 0x5a4) != 0) {
    for (local_c = 0; iVar1 = Queue<unsigned_int>::size(in_stack_ffffffffffffff90), local_c < iVar1;
        local_c = local_c + 1) {
      in_stack_ffffffffffffffd0 = (Queue<unsigned_int> *)(in_RDI + 0x340);
      Queue<unsigned_int>::operator[](in_stack_ffffffffffffff90,in_stack_ffffffffffffff8c);
      pCVar4 = ClauseAllocator::operator[]
                         ((ClauseAllocator *)in_stack_ffffffffffffff90,in_stack_ffffffffffffff8c);
      uVar2 = Clause::mark(pCVar4);
      if (uVar2 == 0) {
        in_stack_ffffffffffffffc8 = in_RDI + 0x340;
        Queue<unsigned_int>::operator[](in_stack_ffffffffffffff90,in_stack_ffffffffffffff8c);
        pCVar4 = ClauseAllocator::operator[]
                           ((ClauseAllocator *)in_stack_ffffffffffffff90,in_stack_ffffffffffffff8c);
        Clause::mark(pCVar4,2);
      }
    }
    for (local_c = 0; iVar1 = vec<char>::size((vec<char> *)(in_RDI + 0x4e8)), local_c < iVar1;
        local_c = local_c + 1) {
      pcVar5 = vec<char>::operator[]((vec<char> *)(in_RDI + 0x4e8),local_c);
      if (*pcVar5 != '\0') {
        this_00 = OccLists<int,_Glucose::vec<unsigned_int>,_Glucose::SimpSolver::ClauseDeleted>::
                  lookup((OccLists<int,_Glucose::vec<unsigned_int>,_Glucose::SimpSolver::ClauseDeleted>
                          *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                         in_stack_ffffffffffffff98);
        for (local_10 = 0; iVar1 = vec<unsigned_int>::size(this_00), local_10 < iVar1;
            local_10 = local_10 + 1) {
          vec<unsigned_int>::operator[](this_00,local_10);
          pCVar4 = ClauseAllocator::operator[]
                             ((ClauseAllocator *)in_stack_ffffffffffffff90,in_stack_ffffffffffffff8c
                             );
          uVar2 = Clause::mark(pCVar4);
          if (uVar2 == 0) {
            vec<unsigned_int>::operator[](this_00,local_10);
            Queue<unsigned_int>::insert
                      (in_stack_ffffffffffffffd0,(uint)((ulong)in_stack_ffffffffffffffc8 >> 0x20));
            vec<unsigned_int>::operator[](this_00,local_10);
            pCVar4 = ClauseAllocator::operator[]
                               ((ClauseAllocator *)in_stack_ffffffffffffff90,
                                in_stack_ffffffffffffff8c);
            Clause::mark(pCVar4,2);
          }
        }
        pcVar5 = vec<char>::operator[]((vec<char> *)(in_RDI + 0x4e8),local_c);
        *pcVar5 = '\0';
      }
    }
    local_c = 0;
    while (iVar1 = local_c, iVar3 = Queue<unsigned_int>::size(in_stack_ffffffffffffff90),
          iVar1 < iVar3) {
      Queue<unsigned_int>::operator[](in_stack_ffffffffffffff90,in_stack_ffffffffffffff8c);
      pCVar4 = ClauseAllocator::operator[]
                         ((ClauseAllocator *)in_stack_ffffffffffffff90,in_stack_ffffffffffffff8c);
      uVar2 = Clause::mark(pCVar4);
      if (uVar2 == 2) {
        in_stack_ffffffffffffff90 = (Queue<unsigned_int> *)(in_RDI + 0x340);
        Queue<unsigned_int>::operator[](in_stack_ffffffffffffff90,in_stack_ffffffffffffff8c);
        pCVar4 = ClauseAllocator::operator[]
                           ((ClauseAllocator *)in_stack_ffffffffffffff90,in_stack_ffffffffffffff8c);
        Clause::mark(pCVar4,0);
      }
      local_c = local_c + 1;
    }
    *(undefined4 *)(in_RDI + 0x5a4) = 0;
  }
  return;
}

Assistant:

void SimpSolver::gatherTouchedClauses()
{
    if (n_touched == 0) return;

    int i,j;
    for (i = j = 0; i < subsumption_queue.size(); i++)
        if (ca[subsumption_queue[i]].mark() == 0)
            ca[subsumption_queue[i]].mark(2);

    for (i = 0; i < touched.size(); i++)
        if (touched[i]){
            const vec<CRef>& cs = occurs.lookup(i);
            for (j = 0; j < cs.size(); j++)
                if (ca[cs[j]].mark() == 0){
                    subsumption_queue.insert(cs[j]);
                    ca[cs[j]].mark(2);
                }
            touched[i] = 0;
        }

    for (i = 0; i < subsumption_queue.size(); i++)
        if (ca[subsumption_queue[i]].mark() == 2)
            ca[subsumption_queue[i]].mark(0);

    n_touched = 0;
}